

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool>
* __thiscall
pstore::json::details::number_matcher<json_out_callbacks>::consume
          (pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool>
           *__return_storage_ptr__,number_matcher<json_out_callbacks> *this,
          parser<json_out_callbacks> *parser,maybe<char,_void> *ch)

{
  char c;
  int iVar1;
  uint uVar2;
  bool bVar3;
  char *pcVar4;
  error_code local_28;
  
  if (ch->valid_ == true) {
    pcVar4 = maybe<char,_void>::operator->(ch);
    iVar1 = (this->super_matcher<json_out_callbacks>).state_;
    if (iVar1 - 1U < 10) {
      c = *pcVar4;
      switch(iVar1) {
      case 1:
        assert_failed("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                      ,0x30a);
      case 2:
        bVar3 = do_leading_minus_state(this,parser,c);
        break;
      case 3:
        bVar3 = do_integer_initial_digit_state(this,parser,c);
        break;
      case 4:
        bVar3 = do_integer_digit_state(this,parser,c);
        break;
      case 5:
        bVar3 = do_frac_state(this,parser,c);
        break;
      default:
        bVar3 = do_frac_digit_state(this,parser,c);
        break;
      case 8:
        bVar3 = do_exponent_sign_state(this,parser,c);
        break;
      case 9:
      case 10:
        bVar3 = do_exponent_digit_state(this,parser,c);
      }
      goto LAB_00130955;
    }
  }
  else {
    if ((parser->error_)._M_value != 0) {
      assert_failed("!parser.has_error ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                    ,0x30d);
    }
    uVar2 = (this->super_matcher<json_out_callbacks>).state_;
    if ((10 < uVar2) || ((0x4b2U >> (uVar2 & 0x1f) & 1) == 0)) {
      local_28._M_cat = get_error_category();
      local_28._M_value = 4;
      matcher<json_out_callbacks>::set_error
                (&this->super_matcher<json_out_callbacks>,parser,&local_28);
    }
    complete(this,parser);
  }
  bVar3 = true;
LAB_00130955:
  *(undefined8 *)
   &(__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
       = 1;
  (__return_storage_ptr__->first)._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  .super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>._M_head_impl =
       (matcher<json_out_callbacks> *)0x0;
  __return_storage_ptr__->second = bVar3;
  return __return_storage_ptr__;
}

Assistant:

std::pair<typename matcher<Callbacks>::pointer, bool>
            number_matcher<Callbacks>::consume (parser<Callbacks> & parser, maybe<char> ch) {
                bool match = true;
                if (ch) {
                    char const c = *ch;
                    switch (this->get_state ()) {
                    case leading_minus_state:
                        match = this->do_leading_minus_state (parser, c);
                        break;
                    case integer_initial_digit_state:
                        match = this->do_integer_initial_digit_state (parser, c);
                        break;
                    case integer_digit_state:
                        match = this->do_integer_digit_state (parser, c);
                        break;
                    case frac_state: match = this->do_frac_state (parser, c); break;
                    case frac_initial_digit_state:
                    case frac_digit_state: match = this->do_frac_digit_state (parser, c); break;
                    case exponent_sign_state:
                        match = this->do_exponent_sign_state (parser, c);
                        break;
                    case exponent_initial_digit_state:
                    case exponent_digit_state:
                        match = this->do_exponent_digit_state (parser, c);
                        break;
                    case done_state: PSTORE_ASSERT (false); break;
                    }
                } else {
                    PSTORE_ASSERT (!parser.has_error ());
                    if (!this->in_terminal_state ()) {
                        this->set_error (parser, error_code::expected_digits);
                    }
                    this->complete (parser);
                }
                return {nullptr, match};
            }